

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void * __thiscall
pstd::pmr::monotonic_buffer_resource::do_allocate
          (monotonic_buffer_resource *this,size_t bytes,size_t align)

{
  MemoryBlock *__x;
  list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  *this_00;
  ulong uVar1;
  size_t sVar2;
  void *pvVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _List_node_base *p_Var5;
  ulong uVar6;
  const_iterator __position;
  value_type local_28;
  
  if (this->blockSize < bytes) {
    iVar4 = (*this->upstreamResource->_vptr_memory_resource[2])(this->upstreamResource,bytes,align);
    local_28.ptr = (void *)CONCAT44(extraout_var,iVar4);
    local_28.size = bytes;
    std::__cxx11::
    list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
    ::push_back(&this->usedBlocks,&local_28);
    p_Var5 = (this->usedBlocks).
             super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
             ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
  }
  else {
    uVar6 = this->currentBlockPos;
    if (uVar6 % align != 0) {
      uVar6 = (uVar6 + align) - uVar6 % align;
      this->currentBlockPos = uVar6;
    }
    uVar1 = (this->currentBlock).size;
    if (uVar1 < uVar6 + bytes) {
      __x = &this->currentBlock;
      if (uVar1 != 0) {
        std::__cxx11::
        list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
        ::push_back(&this->usedBlocks,__x);
        __x->ptr = (void *)0x0;
        (this->currentBlock).size = 0;
      }
      this_00 = &this->availableBlocks;
      __position._M_node = (_List_node_base *)this_00;
      do {
        __position._M_node = (__position._M_node)->_M_next;
        if (__position._M_node == (_List_node_base *)this_00) {
          iVar4 = (*this->upstreamResource->_vptr_memory_resource[2])
                            (this->upstreamResource,this->blockSize,0x10);
          sVar2 = this->blockSize;
          (this->currentBlock).ptr = (void *)CONCAT44(extraout_var_00,iVar4);
          (this->currentBlock).size = sVar2;
          goto LAB_002948fe;
        }
      } while (__position._M_node[1]._M_prev < bytes);
      p_Var5 = __position._M_node[1]._M_prev;
      __x->ptr = __position._M_node[1]._M_next;
      (this->currentBlock).size = (size_t)p_Var5;
      std::__cxx11::
      list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
      ::erase(this_00,__position);
LAB_002948fe:
      uVar6 = 0;
    }
    pvVar3 = (this->currentBlock).ptr;
    this->currentBlockPos = bytes + uVar6;
    p_Var5 = (_List_node_base *)((long)pvVar3 + uVar6);
  }
  return p_Var5;
}

Assistant:

void *do_allocate(size_t bytes, size_t align) override {
        if (bytes > blockSize) {
            // We've got a big allocation; let the current block be so that
            // smaller allocations have a chance at using up more of it.
            usedBlocks.push_back(
                MemoryBlock{upstreamResource->allocate(bytes, align), bytes});
            return usedBlocks.back().ptr;
        }

        if ((currentBlockPos % align) != 0)
            currentBlockPos += align - (currentBlockPos % align);
        DCHECK_EQ(0, currentBlockPos % align);

        if (currentBlockPos + bytes > currentBlock.size) {
            // Add current block to _usedBlocks_ list
            if (currentBlock.size) {
                usedBlocks.push_back(currentBlock);
                currentBlock = {};
            }

            // Get new block of memory for _MemoryArena_

            // Try to get memory block from _availableBlocks_
            for (auto iter = availableBlocks.begin(); iter != availableBlocks.end();
                 ++iter) {
                if (bytes <= iter->size) {
                    currentBlock = std::move(*iter);
                    availableBlocks.erase(iter);
                    goto success;
                }
            }
            currentBlock = {
                upstreamResource->allocate(blockSize, alignof(std::max_align_t)),
                blockSize};
        success:
            currentBlockPos = 0;
        }

        void *ptr = (char *)currentBlock.ptr + currentBlockPos;
        currentBlockPos += bytes;
        return ptr;
    }